

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

bool llvm::DWARFDebugLoclists::dumpLocationList
               (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,raw_ostream *OS,
               uint64_t BaseAddr,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent
               )

{
  undefined4 uVar1;
  raw_ostream *this;
  Error EVar2;
  Error *E_00;
  ulong uVar3;
  bool bVar4;
  StringRef Str;
  StringRef SVar5;
  function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F;
  undefined1 local_98 [32];
  DWARFUnit **local_78;
  DIDumpOptions *local_70;
  uint *local_68;
  Error *local_60;
  uint64_t local_58;
  uint64_t BaseAddr_local;
  MCRegisterInfo *MRI_local;
  char *local_40;
  Error E;
  size_t MaxEncodingStringLength;
  
  uVar1 = DumpOpts._20_4_;
  E.Payload = (ErrorInfoBase *)0x0;
  bVar4 = DumpOpts.Verbose == true;
  DumpOpts._20_4_ = uVar1;
  local_58 = BaseAddr;
  BaseAddr_local = (uint64_t)MRI;
  EVar2.Payload = E.Payload;
  if (bVar4) {
    SVar5 = dwarf::LocListEncodingString(0);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2 = E;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(1);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(2);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(3);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(4);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(5);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(6);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(7);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
    E.Payload = EVar2.Payload;
    SVar5 = dwarf::LocListEncodingString(8);
    EVar2.Payload = (ErrorInfoBase *)SVar5.Length;
    if ((ErrorInfoBase *)SVar5.Length < E.Payload) {
      EVar2.Payload = E.Payload;
    }
  }
  E.Payload = EVar2.Payload;
  local_98._8_8_ = "0x%8.8lx: ";
  local_98._0_8_ = &PTR_home_00d8c7c0;
  local_98._16_8_ = *Offset;
  raw_ostream::operator<<(OS,(format_object_base *)local_98);
  local_98._8_8_ = &local_58;
  local_98._24_8_ = &BaseAddr_local;
  local_78 = &U;
  local_70 = &DumpOpts;
  local_68 = &Indent;
  local_60 = &E;
  F.callback = (_func_bool_intptr_t_Entry_ptr *)(ulong)Version;
  F.callable = (intptr_t)
               function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
               callback_fn<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
  ;
  local_98._0_8_ = OS;
  local_98._16_8_ = Data;
  visitLocationList((DWARFDataExtractor *)&local_40,(uint64_t *)Data,(uint16_t)Offset,F);
  uVar3 = (ulong)local_40 & 0xfffffffffffffffe;
  local_40 = (char *)(uVar3 != 0 | uVar3);
  if (uVar3 != 0) {
    SVar5.Length = 1;
    SVar5.Data = "\n";
    raw_ostream::operator<<(OS,SVar5);
    raw_ostream::indent(OS,Indent);
    Str.Length = 7;
    Str.Data = "error: ";
    this = raw_ostream::operator<<(OS,Str);
    MRI_local = (MCRegisterInfo *)((ulong)local_40 | 1);
    local_40 = (char *)0x0;
    toString_abi_cxx11_((string *)local_98,(llvm *)&MRI_local,E_00);
    raw_ostream::write(this,(int)local_98._0_8_,(void *)local_98._8_8_,(size_t)F.callback);
    if ((raw_ostream *)local_98._0_8_ != (raw_ostream *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    if ((long *)((ulong)MRI_local & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)MRI_local & 0xfffffffffffffffe) + 8))();
    }
  }
  if ((long *)((ulong)local_40 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_40 & 0xfffffffffffffffe) + 8))();
  }
  return uVar3 == 0;
}

Assistant:

bool DWARFDebugLoclists::dumpLocationList(const DWARFDataExtractor &Data,
                                          uint64_t *Offset, uint16_t Version,
                                          raw_ostream &OS, uint64_t BaseAddr,
                                          const MCRegisterInfo *MRI,
                                          DWARFUnit *U, DIDumpOptions DumpOpts,
                                          unsigned Indent) {
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
#define HANDLE_DW_LLE(ID, NAME)                                                \
  MaxEncodingStringLength = std::max(MaxEncodingStringLength,                  \
                                     dwarf::LocListEncodingString(ID).size());
#include "llvm/BinaryFormat/Dwarf.def"
  }

  OS << format("0x%8.8" PRIx64 ": ", *Offset);
  Error E = visitLocationList(Data, Offset, Version, [&](const Entry &E) {
    E.dump(OS, BaseAddr, Data.isLittleEndian(), Data.getAddressSize(), MRI, U,
           DumpOpts, Indent, MaxEncodingStringLength);
    return true;
  });
  if (E) {
    OS << "\n";
    OS.indent(Indent);
    OS << "error: " << toString(std::move(E));
    return false;
  }
  return true;
}